

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# list.c
# Opt level: O0

void list_append_to(list_t *list,void *data,list_node_t *old)

{
  list_node_t *plVar1;
  list_node_t *new;
  list_node_t *old_local;
  void *data_local;
  list_t *list_local;
  
  plVar1 = list_node_new();
  plVar1->data = data;
  if (old->next == (list_node_t *)0x0) {
    list->tail = plVar1;
  }
  else {
    old->next->prev = plVar1;
  }
  plVar1->next = old->next;
  plVar1->prev = old;
  old->next = plVar1;
  return;
}

Assistant:

void
list_append_to(
    list_t* list,
    void* data,
    list_node_t* old)
{
    list_node_t* new = list_node_new();
    new->data = data;

    if (old->next)
        old->next->prev = new;
    else
        list->tail = new;
    new->next = old->next;
    new->prev = old;
    old->next = new;
}